

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh
          (IfcReinforcingMesh *this,void **vtt)

{
  void **vtt_local;
  IfcReinforcingMesh *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingMesh,_8UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingMesh,_8UL> *)
             &(this->super_IfcReinforcingElement).field_0x190,vtt + 0x3d);
  Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement
            (&this->super_IfcReinforcingElement,vtt + 1);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}